

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImFont *font;
  ImFontConfig *pIVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  ImGuiStyle *v;
  char *pcVar7;
  size_t sVar8;
  ImFontGlyph *pIVar9;
  ImDrawList *this;
  int i;
  long lVar10;
  ulong uVar11;
  void *ptr_id;
  uint uVar12;
  ImVec4 *pIVar13;
  ImWchar c;
  ImVec4 *pIVar14;
  ImGuiStyle *__dest;
  int i_1;
  int iVar15;
  uint uVar16;
  ImFontAtlas *pIVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool window_border;
  ImVec2 cell_p2;
  ImVec4 local_b8;
  float local_a8;
  float local_a4;
  ImGuiIO *local_a0;
  ImVec4 local_98;
  ImFontAtlas *local_88;
  ulong local_80;
  ImVec2 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  v = GetStyle();
  if (ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') {
    iVar15 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    if (iVar15 != 0) {
      ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
      __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
    }
  }
  if ((ref == (ImGuiStyle *)0x0) && ((ShowStyleEditor(ImGuiStyle*)::init & 1) == 0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x3b0);
  }
  ShowStyleEditor(ImGuiStyle*)::init = 1;
  __dest = &ShowStyleEditor::ref_saved_style;
  if (ref != (ImGuiStyle *)0x0) {
    __dest = ref;
  }
  fVar18 = GetWindowWidth();
  PushItemWidth(fVar18 * 0.5);
  bVar4 = ShowStyleSelector("Colors##Selector");
  if (bVar4) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x3b0);
  }
  ShowFontSelector("Fonts##Selector");
  bVar4 = SliderFloat("FrameRounding",&v->FrameRounding,0.0,12.0,"%.0f",1.0);
  if (bVar4) {
    v->GrabRounding = v->FrameRounding;
  }
  local_b8.x._0_1_ = 0.0 < v->WindowBorderSize;
  bVar4 = Checkbox("WindowBorder",(bool *)&local_b8);
  if (bVar4) {
    if (local_b8.x._0_1_ == '\0') {
      fVar18 = 0.0;
    }
    else {
      fVar18 = 1.0;
    }
    v->WindowBorderSize = fVar18;
  }
  SameLine(0.0,-1.0);
  local_b8.x._0_1_ = 0.0 < v->FrameBorderSize;
  bVar4 = Checkbox("FrameBorder",(bool *)&local_b8);
  if (bVar4) {
    if (local_b8.x._0_1_ == '\0') {
      fVar18 = 0.0;
    }
    else {
      fVar18 = 1.0;
    }
    v->FrameBorderSize = fVar18;
  }
  SameLine(0.0,-1.0);
  local_b8.x._0_1_ = 0.0 < v->PopupBorderSize;
  bVar4 = Checkbox("PopupBorder",(bool *)&local_b8);
  if (bVar4) {
    fVar18 = 1.0;
    if (local_b8.x._0_1_ == '\0') {
      fVar18 = 0.0;
    }
    v->PopupBorderSize = fVar18;
  }
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  bVar4 = Button("Save Ref",(ImVec2 *)&local_b8);
  if (bVar4) {
    memcpy(&ShowStyleEditor::ref_saved_style,v,0x3b0);
    memmove(__dest,v,0x3b0);
  }
  SameLine(0.0,-1.0);
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  bVar4 = Button("Revert Ref",(ImVec2 *)&local_b8);
  if (bVar4) {
    memcpy(v,__dest,0x3b0);
  }
  SameLine(0.0,-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar4 = BeginTabBar("##tabs",0);
  if (bVar4) {
    bVar4 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar4) {
      Text("Main");
      SliderFloat2("WindowPadding",&(v->WindowPadding).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("FramePadding",&(v->FramePadding).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("ItemSpacing",&(v->ItemSpacing).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("ItemInnerSpacing",&(v->ItemInnerSpacing).x,0.0,20.0,"%.0f",1.0);
      SliderFloat2("TouchExtraPadding",&(v->TouchExtraPadding).x,0.0,10.0,"%.0f",1.0);
      SliderFloat("IndentSpacing",&v->IndentSpacing,0.0,30.0,"%.0f",1.0);
      SliderFloat("ScrollbarSize",&v->ScrollbarSize,1.0,20.0,"%.0f",1.0);
      SliderFloat("GrabMinSize",&v->GrabMinSize,1.0,20.0,"%.0f",1.0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&v->WindowBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("ChildBorderSize",&v->ChildBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("PopupBorderSize",&v->PopupBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("FrameBorderSize",&v->FrameBorderSize,0.0,1.0,"%.0f",1.0);
      SliderFloat("TabBorderSize",&v->TabBorderSize,0.0,1.0,"%.0f",1.0);
      Text("Rounding");
      SliderFloat("WindowRounding",&v->WindowRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("ChildRounding",&v->ChildRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("FrameRounding",&v->FrameRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("PopupRounding",&v->PopupRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("ScrollbarRounding",&v->ScrollbarRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("GrabRounding",&v->GrabRounding,0.0,12.0,"%.0f",1.0);
      SliderFloat("TabRounding",&v->TabRounding,0.0,12.0,"%.0f",1.0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(v->WindowTitleAlign).x,0.0,1.0,"%.2f",1.0);
      local_b8.x = (float)(v->WindowMenuButtonPosition + 1);
      bVar4 = Combo("WindowMenuButtonPosition",(int *)&local_b8,"None",-1);
      if (bVar4) {
        v->WindowMenuButtonPosition = (int)local_b8.x + -1;
      }
      Combo("ColorButtonPosition",&v->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(v->ButtonTextAlign).x,0.0,1.0,"%.2f",1.0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(v->SelectableTextAlign).x,0.0,1.0,"%.2f",1.0);
      SameLine(0.0,-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine(0.0,-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(v->DisplaySafeAreaPadding).x,0.0,30.0,"%.0f",1.0);
      EndTabItem();
    }
    bVar4 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar4) {
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      bVar4 = Button("Export",(ImVec2 *)&local_b8);
      if (bVar4) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        lVar10 = 0;
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        pIVar14 = v->Colors;
        pIVar13 = __dest->Colors;
        do {
          pcVar7 = GetStyleColorName((ImGuiCol)lVar10);
          if ((ShowStyleEditor::output_only_modified != true) ||
             (auVar19[0] = -(*(char *)&pIVar13->x == *(char *)&pIVar14->x),
             auVar19[1] = -(*(char *)((long)&pIVar13->x + 1) == *(char *)((long)&pIVar14->x + 1)),
             auVar19[2] = -(*(char *)((long)&pIVar13->x + 2) == *(char *)((long)&pIVar14->x + 2)),
             auVar19[3] = -(*(char *)((long)&pIVar13->x + 3) == *(char *)((long)&pIVar14->x + 3)),
             auVar19[4] = -(*(char *)&pIVar13->y == *(char *)&pIVar14->y),
             auVar19[5] = -(*(char *)((long)&pIVar13->y + 1) == *(char *)((long)&pIVar14->y + 1)),
             auVar19[6] = -(*(char *)((long)&pIVar13->y + 2) == *(char *)((long)&pIVar14->y + 2)),
             auVar19[7] = -(*(char *)((long)&pIVar13->y + 3) == *(char *)((long)&pIVar14->y + 3)),
             auVar19[8] = -(*(char *)&pIVar13->z == *(char *)&pIVar14->z),
             auVar19[9] = -(*(char *)((long)&pIVar13->z + 1) == *(char *)((long)&pIVar14->z + 1)),
             auVar19[10] = -(*(char *)((long)&pIVar13->z + 2) == *(char *)((long)&pIVar14->z + 2)),
             auVar19[0xb] = -(*(char *)((long)&pIVar13->z + 3) == *(char *)((long)&pIVar14->z + 3)),
             auVar19[0xc] = -(*(char *)&pIVar13->w == *(char *)&pIVar14->w),
             auVar19[0xd] = -(*(char *)((long)&pIVar13->w + 1) == *(char *)((long)&pIVar14->w + 1)),
             auVar19[0xe] = -(*(char *)((long)&pIVar13->w + 2) == *(char *)((long)&pIVar14->w + 2)),
             auVar19[0xf] = -(*(char *)((long)&pIVar13->w + 3) == *(char *)((long)&pIVar14->w + 3)),
             (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar19[0xf] >> 7) << 0xf) != 0xffff)) {
            sVar8 = strlen(pcVar7);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    (double)pIVar14->x,(double)pIVar14->y,(double)pIVar14->z,(double)pIVar14->w,
                    pcVar7,(ulong)(0x17 - (int)sVar8),"");
          }
          lVar10 = lVar10 + 1;
          pIVar13 = pIVar13 + 1;
          pIVar14 = pIVar14 + 1;
        } while (lVar10 != 0x30);
        LogFinish();
      }
      SameLine(0.0,-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine(0.0,-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if (ShowStyleEditor(ImGuiStyle*)::filter == '\0') {
        iVar15 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter);
        if (iVar15 != 0) {
          ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
          __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
          __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
        }
      }
      fVar18 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar18 * 16.0);
      lVar10 = 0;
      RadioButton("Opaque",&ShowStyleEditor::alpha_flags,0);
      SameLine(0.0,-1.0);
      RadioButton("Alpha",&ShowStyleEditor::alpha_flags,0x20000);
      SameLine(0.0,-1.0);
      RadioButton("Both",&ShowStyleEditor::alpha_flags,0x40000);
      SameLine(0.0,-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu."
                );
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      BeginChild("##colors",(ImVec2 *)&local_b8,true,0x80c000);
      PushItemWidth(-160.0);
      pIVar14 = v->Colors;
      pIVar13 = __dest->Colors;
      do {
        pcVar7 = GetStyleColorName((ImGuiCol)lVar10);
        bVar4 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,pcVar7,(char *)0x0);
        if (bVar4) {
          PushID((ImGuiCol)lVar10);
          ColorEdit4("##color",&pIVar14->x,ShowStyleEditor::alpha_flags | 0x10000);
          auVar20[0] = -(*(char *)&pIVar13->x == *(char *)&pIVar14->x);
          auVar20[1] = -(*(char *)((long)&pIVar13->x + 1) == *(char *)((long)&pIVar14->x + 1));
          auVar20[2] = -(*(char *)((long)&pIVar13->x + 2) == *(char *)((long)&pIVar14->x + 2));
          auVar20[3] = -(*(char *)((long)&pIVar13->x + 3) == *(char *)((long)&pIVar14->x + 3));
          auVar20[4] = -(*(char *)&pIVar13->y == *(char *)&pIVar14->y);
          auVar20[5] = -(*(char *)((long)&pIVar13->y + 1) == *(char *)((long)&pIVar14->y + 1));
          auVar20[6] = -(*(char *)((long)&pIVar13->y + 2) == *(char *)((long)&pIVar14->y + 2));
          auVar20[7] = -(*(char *)((long)&pIVar13->y + 3) == *(char *)((long)&pIVar14->y + 3));
          auVar20[8] = -(*(char *)&pIVar13->z == *(char *)&pIVar14->z);
          auVar20[9] = -(*(char *)((long)&pIVar13->z + 1) == *(char *)((long)&pIVar14->z + 1));
          auVar20[10] = -(*(char *)((long)&pIVar13->z + 2) == *(char *)((long)&pIVar14->z + 2));
          auVar20[0xb] = -(*(char *)((long)&pIVar13->z + 3) == *(char *)((long)&pIVar14->z + 3));
          auVar20[0xc] = -(*(char *)&pIVar13->w == *(char *)&pIVar14->w);
          auVar20[0xd] = -(*(char *)((long)&pIVar13->w + 1) == *(char *)((long)&pIVar14->w + 1));
          auVar20[0xe] = -(*(char *)((long)&pIVar13->w + 2) == *(char *)((long)&pIVar14->w + 2));
          auVar20[0xf] = -(*(char *)((long)&pIVar13->w + 3) == *(char *)((long)&pIVar14->w + 3));
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
            SameLine(0.0,(v->ItemInnerSpacing).x);
            local_b8.x = 0.0;
            local_b8.y = 0.0;
            bVar4 = Button("Save",(ImVec2 *)&local_b8);
            if (bVar4) {
              fVar18 = pIVar14->y;
              fVar2 = pIVar14->z;
              fVar3 = pIVar14->w;
              pIVar13->x = pIVar14->x;
              pIVar13->y = fVar18;
              pIVar13->z = fVar2;
              pIVar13->w = fVar3;
            }
            SameLine(0.0,(v->ItemInnerSpacing).x);
            local_b8.x = 0.0;
            local_b8.y = 0.0;
            bVar4 = Button("Revert",(ImVec2 *)&local_b8);
            if (bVar4) {
              fVar18 = pIVar13->y;
              fVar2 = pIVar13->z;
              fVar3 = pIVar13->w;
              pIVar14->x = pIVar13->x;
              pIVar14->y = fVar18;
              pIVar14->z = fVar2;
              pIVar14->w = fVar3;
            }
          }
          SameLine(0.0,(v->ItemInnerSpacing).x);
          TextUnformatted(pcVar7,(char *)0x0);
          PopID();
        }
        lVar10 = lVar10 + 1;
        pIVar13 = pIVar13 + 1;
        pIVar14 = pIVar14 + 1;
      } while (lVar10 != 0x30);
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar4 = BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar4) {
      local_a0 = GetIO();
      pIVar17 = local_a0->Fonts;
      HelpMarker("Read FAQ and misc/fonts/README.txt for details on font loading.");
      PushItemWidth(120.0);
      if (0 < (pIVar17->Fonts).Size) {
        uVar11 = 0;
        local_88 = pIVar17;
        do {
          font = (pIVar17->Fonts).Data[uVar11];
          PushID(font);
          pcVar7 = font->ConfigData->Name;
          if (font->ConfigData == (ImFontConfig *)0x0) {
            pcVar7 = "";
          }
          local_80 = uVar11;
          bVar4 = TreeNode(font,"Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
                           (double)font->FontSize,uVar11 & 0xffffffff,pcVar7,
                           (ulong)(uint)(font->Glyphs).Size,(ulong)(uint)(int)font->ConfigDataCount)
          ;
          SameLine(0.0,-1.0);
          bVar5 = SmallButton("Set as default");
          if (bVar5) {
            local_a0->FontDefault = font;
          }
          if (bVar4) {
            PushFont(font);
            Text("The quick brown fox jumps over the lazy dog");
            PopFont();
            DragFloat("Font scale",&font->Scale,0.005,0.3,2.0,"%.1f",1.0);
            SameLine(0.0,-1.0);
            HelpMarker(
                      "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)"
                      );
            InputFloat("Font offset",&(font->DisplayOffset).y,1.0,1.0,"%.0f",0);
            Text("Ascent: %f, Descent: %f, Height: %f",(double)font->Ascent,(double)font->Descent,
                 (double)(font->Ascent - font->Descent));
            Text("Fallback character: \'%c\' (U+%04X)",(ulong)font->FallbackChar);
            Text("Ellipsis character: \'%c\' (U+%04X)",(ulong)font->EllipsisChar);
            fVar18 = (float)font->MetricsTotalSurface;
            if (fVar18 < 0.0) {
              fVar18 = sqrtf(fVar18);
            }
            else {
              fVar18 = SQRT(fVar18);
            }
            Text("Texture surface: %d pixels (approx) ~ %dx%d",
                 (ulong)(uint)font->MetricsTotalSurface,(ulong)(uint)(int)fVar18);
            if (0 < font->ConfigDataCount) {
              lVar10 = 0x56;
              uVar11 = 0;
              do {
                pIVar1 = font->ConfigData;
                if (pIVar1 != (ImFontConfig *)0x0) {
                  BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d",
                             uVar11 & 0xffffffff,pIVar1->Name + lVar10 + -0x56,
                             (ulong)*(uint *)((long)pIVar1 + lVar10 + -0x3e),
                             (ulong)*(uint *)((long)pIVar1 + lVar10 + -0x3a),
                             (ulong)*(byte *)((long)pIVar1 + lVar10 + -0x36));
                }
                uVar11 = uVar11 + 1;
                lVar10 = lVar10 + 0x88;
              } while ((long)uVar11 < (long)font->ConfigDataCount);
            }
            bVar4 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(font->Glyphs).Size);
            if (bVar4) {
              ptr_id = (void *)0x0;
              do {
                iVar15 = 0;
                uVar12 = 0;
                do {
                  pIVar9 = ImFont::FindGlyphNoFallback(font,(short)ptr_id + (short)iVar15);
                  uVar12 = (uVar12 + 1) - (uint)(pIVar9 == (ImFontGlyph *)0x0);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 0x100);
                if (uVar12 != 0) {
                  pcVar7 = "glyphs";
                  if (uVar12 == 1) {
                    pcVar7 = "glyph";
                  }
                  bVar4 = TreeNode(ptr_id,"U+%04X..U+%04X (%d %s)",(ulong)ptr_id & 0xffffffff,
                                   (ulong)((uint)ptr_id | 0xff),(ulong)uVar12,pcVar7);
                  if (bVar4) {
                    local_a4 = font->FontSize;
                    local_a8 = (v->ItemSpacing).y;
                    local_78 = GetCursorScreenPos();
                    this = GetWindowDrawList();
                    local_a8 = local_a8 + local_a4;
                    local_68 = local_78.y;
                    fStack_64 = local_78.y;
                    fStack_60 = local_78.y;
                    fStack_5c = local_78.y;
                    uVar11 = 0;
                    do {
                      uVar16 = (uint)uVar11;
                      local_b8.x = (float)(uVar16 & 0xf) * local_a8 + local_78.x;
                      local_b8.y = (float)(int)(uVar11 >> 4) * local_a8 + local_68;
                      local_98.y = local_b8.y + local_a4;
                      local_98.x = local_b8.x + local_a4;
                      uVar12 = (uint)ptr_id + uVar16;
                      c = (ImWchar)uVar12;
                      pIVar9 = ImFont::FindGlyphNoFallback(font,c);
                      IVar6 = 0x64ffffff;
                      if (pIVar9 == (ImFontGlyph *)0x0) {
                        IVar6 = 0x32ffffff;
                      }
                      ImDrawList::AddRect(this,(ImVec2 *)&local_b8,(ImVec2 *)&local_98,IVar6,0.0,0xf
                                          ,1.0);
                      if (pIVar9 != (ImFontGlyph *)0x0) {
                        local_58.x = local_b8.x;
                        local_58.y = local_b8.y;
                        uStack_50 = 0;
                        IVar6 = GetColorU32(0,1.0);
                        ImFont::RenderChar(font,this,local_a4,local_58,IVar6,c);
                        bVar4 = IsMouseHoveringRect((ImVec2 *)&local_b8,(ImVec2 *)&local_98,true);
                        if (bVar4) {
                          BeginTooltip();
                          Text("Codepoint: U+%04X",(ulong)uVar12);
                          Separator();
                          Text("AdvanceX: %.1f",(double)pIVar9->AdvanceX);
                          Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)pIVar9->X0,(double)pIVar9->Y0
                               ,(double)pIVar9->X1,(double)pIVar9->Y1);
                          Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)pIVar9->U0,(double)pIVar9->V0,
                               (double)pIVar9->U1,(double)pIVar9->V1);
                          EndTooltip();
                        }
                      }
                      uVar11 = (ulong)(uVar16 + 1);
                    } while (uVar16 + 1 != 0x100);
                    local_b8.y = local_a8 * 16.0;
                    local_b8.x = local_a8 * 16.0;
                    Dummy((ImVec2 *)&local_b8);
                    TreePop();
                  }
                }
                bVar4 = ptr_id < (void *)0xff00;
                ptr_id = (void *)((long)ptr_id + 0x100);
              } while (bVar4);
              TreePop();
            }
            TreePop();
            pIVar17 = local_88;
          }
          PopID();
          uVar11 = local_80 + 1;
        } while ((long)uVar11 < (long)(pIVar17->Fonts).Size);
      }
      bVar4 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)pIVar17->TexWidth
                       ,(ulong)(uint)pIVar17->TexHeight);
      if (bVar4) {
        local_b8.x = 1.0;
        local_b8.y = 1.0;
        local_b8.z = 1.0;
        local_b8.w = 1.0;
        local_98.x = 1.0;
        local_98.y = 1.0;
        local_98.z = 1.0;
        local_98.w = 0.5;
        local_38.x = (float)pIVar17->TexWidth;
        local_38.y = (float)pIVar17->TexHeight;
        local_40.x = 0.0;
        local_40.y = 0.0;
        local_48.x = 1.0;
        local_48.y = 1.0;
        Image(pIVar17->TexID,&local_38,&local_40,&local_48,&local_b8,&local_98);
        TreePop();
      }
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure."
                );
      bVar4 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",1.0);
      if (bVar4) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",&local_a0->FontGlobalScale,0.005,0.3,2.0,"%.2f",1.0);
      PopItemWidth();
      EndTabItem();
    }
    bVar4 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar4) {
      Checkbox("Anti-aliased lines",&v->AntiAliasedLines);
      SameLine(0.0,-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased fill",&v->AntiAliasedFill);
      PushItemWidth(100.0);
      DragFloat("Curve Tessellation Tolerance",&v->CurveTessellationTol,0.02,0.1,3.4028235e+38,
                "%.2f",2.0);
      if (v->CurveTessellationTol <= 0.1 && v->CurveTessellationTol != 0.1) {
        v->CurveTessellationTol = 0.1;
      }
      DragFloat("Global Alpha",&v->Alpha,0.005,0.2,1.0,"%.2f",1.0);
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to (else it compares to an internally stored reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool window_border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &window_border)) style.WindowBorderSize = window_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool frame_border = (style.FrameBorderSize > 0.0f); if (ImGui::Checkbox("FrameBorder", &frame_border)) style.FrameBorderSize = frame_border ? 1.0f : 0.0f; }
    ImGui::SameLine();
    { bool popup_border = (style.PopupBorderSize > 0.0f); if (ImGui::Checkbox("PopupBorder", &popup_border)) style.PopupBorderSize = popup_border ? 1.0f : 0.0f; }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker("Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding"); ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE, name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            ImGui::RadioButton("Opaque", &alpha_flags, 0); ImGui::SameLine();
            ImGui::RadioButton("Alpha", &alpha_flags, ImGuiColorEditFlags_AlphaPreview); ImGui::SameLine();
            ImGui::RadioButton("Both", &alpha_flags, ImGuiColorEditFlags_AlphaPreviewHalf); ImGui::SameLine();
            HelpMarker("In the color list:\nLeft-click on colored square to open color picker,\nRight-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font, so instead of "Save"/"Revert" you'd use icons.
                    // Read the FAQ and misc/fonts/README.txt about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) ref->Colors[i] = style.Colors[i];
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) style.Colors[i] = ref->Colors[i];
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and misc/fonts/README.txt for details on font loading.");
            ImGui::PushItemWidth(120);
            for (int i = 0; i < atlas->Fonts.Size; i++)
            {
                ImFont* font = atlas->Fonts[i];
                ImGui::PushID(font);
                bool font_details_opened = ImGui::TreeNode(font, "Font %d: \"%s\"\n%.2f px, %d glyphs, %d file(s)", i, font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
                ImGui::SameLine(); if (ImGui::SmallButton("Set as default")) { io.FontDefault = font; }
                if (font_details_opened)
                {
                    ImGui::PushFont(font);
                    ImGui::Text("The quick brown fox jumps over the lazy dog");
                    ImGui::PopFont();
                    ImGui::DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");   // Scale only this font
                    ImGui::SameLine(); HelpMarker("Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system should hopefully be rewritten in the future to make scaling more natural and automatic.)");
                    ImGui::InputFloat("Font offset", &font->DisplayOffset.y, 1, 1, "%.0f");
                    ImGui::Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
                    ImGui::Text("Fallback character: '%c' (U+%04X)", font->FallbackChar, font->FallbackChar);
                    ImGui::Text("Ellipsis character: '%c' (U+%04X)", font->EllipsisChar, font->EllipsisChar);
                    const float surface_sqrt = sqrtf((float)font->MetricsTotalSurface);
                    ImGui::Text("Texture surface: %d pixels (approx) ~ %dx%d", font->MetricsTotalSurface, (int)surface_sqrt, (int)surface_sqrt);
                    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
                        if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                            ImGui::BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d", config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH);
                    if (ImGui::TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
                    {
                        // Display all glyphs of the fonts in separate pages of 256 characters
                        for (int base = 0; base < 0x10000; base += 256)
                        {
                            int count = 0;
                            for (int n = 0; n < 256; n++)
                                count += font->FindGlyphNoFallback((ImWchar)(base + n)) ? 1 : 0;
                            if (count > 0 && ImGui::TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                            {
                                float cell_size = font->FontSize * 1;
                                float cell_spacing = style.ItemSpacing.y;
                                ImVec2 base_pos = ImGui::GetCursorScreenPos();
                                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                                for (int n = 0; n < 256; n++)
                                {
                                    ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                                    ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                                    const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                                    draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                                    if (glyph)
                                        font->RenderChar(draw_list, cell_size, cell_p1, ImGui::GetColorU32(ImGuiCol_Text), (ImWchar)(base + n)); // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions available to generate a string.
                                    if (glyph && ImGui::IsMouseHoveringRect(cell_p1, cell_p2))
                                    {
                                        ImGui::BeginTooltip();
                                        ImGui::Text("Codepoint: U+%04X", base + n);
                                        ImGui::Separator();
                                        ImGui::Text("AdvanceX: %.1f", glyph->AdvanceX);
                                        ImGui::Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                                        ImGui::Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                                        ImGui::EndTooltip();
                                    }
                                }
                                ImGui::Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
                                ImGui::TreePop();
                            }
                        }
                        ImGui::TreePop();
                    }
                    ImGui::TreePop();
                }
                ImGui::PopID();
            }
            if (ImGui::TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
            {
                ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
                ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
                ImGui::Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0, 0), ImVec2(1, 1), tint_col, border_col);
                ImGui::TreePop();
            }

            HelpMarker("Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.");
            static float window_scale = 1.0f;
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, 0.3f, 2.0f, "%.2f"))   // scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, 0.3f, 2.0f, "%.2f");      // scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines); ImGui::SameLine(); HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");
            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(100);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, FLT_MAX, "%.2f", 2.0f);
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;
            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}